

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_Model_get_index(HTS_Model *model,size_t state_index,char *string,size_t *tree_index,
                        size_t *pdf_index)

{
  HTS_Tree *pHVar1;
  HTS_Pattern *pHVar2;
  HTS_Boolean HVar3;
  size_t sVar4;
  _HTS_Pattern *p_Var5;
  _HTS_Tree *p_Var6;
  HTS_Tree *pHVar7;
  
  *tree_index = 2;
  *pdf_index = 1;
  pHVar1 = model->tree;
  p_Var6 = pHVar1;
  if (pHVar1 != (HTS_Tree *)0x0) {
    for (; pHVar7 = pHVar1, p_Var6 != (HTS_Tree *)0x0; p_Var6 = p_Var6->next) {
      if (p_Var6->state == state_index) {
        pHVar2 = p_Var6->head;
        for (p_Var5 = pHVar2; pHVar7 = p_Var6, p_Var5 != (HTS_Pattern *)0x0; p_Var5 = p_Var5->next)
        {
          HVar3 = HTS_pattern_match(string,p_Var5->string);
          if (HVar3 != '\0') goto LAB_00108754;
        }
        if (pHVar2 == (HTS_Pattern *)0x0) break;
      }
      *tree_index = *tree_index + 1;
    }
LAB_00108754:
    sVar4 = HTS_Tree_search_node(pHVar7,string);
    *pdf_index = sVar4;
  }
  return;
}

Assistant:

static void HTS_Model_get_index(HTS_Model * model, size_t state_index, const char *string, size_t * tree_index, size_t * pdf_index)
{
   HTS_Tree *tree;
   HTS_Pattern *pattern;
   HTS_Boolean find;

   (*tree_index) = 2;
   (*pdf_index) = 1;

   if (model->tree == NULL)
      return;

   find = FALSE;
   for (tree = model->tree; tree; tree = tree->next) {
      if (tree->state == state_index) {
         pattern = tree->head;
         if (!pattern)
            find = TRUE;
         for (; pattern; pattern = pattern->next)
            if (HTS_pattern_match(string, pattern->string)) {
               find = TRUE;
               break;
            }
         if (find)
            break;
      }
      (*tree_index)++;
   }

   if (tree != NULL) {
      (*pdf_index) = HTS_Tree_search_node(tree, string);
   } else {
      (*pdf_index) = HTS_Tree_search_node(model->tree, string);
   }
}